

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O3

void __thiscall
HdlcAnalyzerResults::GenerateExportFile
          (HdlcAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  undefined8 uVar1;
  _Alloc_hider _Var2;
  long lVar3;
  char cVar4;
  HdlcFrameType HVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  ostream *poVar9;
  long lVar10;
  undefined4 extraout_var;
  undefined4 uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  Frame fcsFrame;
  string sep;
  Frame firstAddressFrame;
  char escapeStr [5];
  ofstream fileStream;
  char addressStr [64];
  char timeStr [64];
  undefined1 auStack_3d8 [12];
  DisplayBase local_3cc;
  string local_3c8;
  undefined2 local_3a8;
  string local_3a0;
  undefined2 local_380;
  string local_378;
  ulonglong local_358;
  undefined8 uStack_350;
  ulonglong local_348;
  undefined8 uStack_340;
  undefined2 local_338;
  ulong local_330;
  uint local_324;
  undefined4 local_320;
  uint local_31c;
  long local_318;
  ulonglong local_310;
  long local_308;
  char local_2fd [5];
  long local_2f8;
  filebuf local_2f0 [240];
  ios_base local_200 [264];
  ulonglong local_f8;
  undefined8 uStack_f0;
  ulonglong local_e8;
  undefined8 uStack_e0;
  undefined2 local_d8;
  char local_78 [72];
  
  local_3cc = display_base;
  std::ofstream::ofstream(&local_2f8,file,_S_out);
  local_310 = Analyzer::GetTriggerSample();
  local_31c = Analyzer::GetSampleRate();
  uVar7 = (ulong)this->mSettings->mHdlcFcs;
  uVar12 = 0;
  if (uVar7 < 3) {
    uVar12 = *(uint *)(&DAT_0010f124 + uVar7 * 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2f8,"Time[s],Address,Control,Information,FCS",0x27);
  std::ios::widen((char)(ostream *)&local_2f8 + (char)*(undefined8 *)(local_2f8 + -0x18));
  std::ostream::put((char)&local_2f8);
  std::ostream::flush();
  AnalyzerHelpers::GetNumberString(0x7d,local_3cc,8,local_2fd,5);
  uVar7 = AnalyzerResults::GetNumFrames();
  switch(this->mSettings->mHdlcControl) {
  case HDLC_BASIC_CONTROL_FIELD:
    uVar6 = 1;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
    uVar6 = 2;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
    uVar6 = 4;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
    uVar6 = 8;
    break;
  default:
    uVar11 = 0;
    uVar6 = 0;
    goto LAB_0010b88a;
  }
  uVar11 = 0x10f001;
LAB_0010b88a:
  if (uVar7 == 0) {
    AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  }
  else {
    local_308 = (ulong)uVar6 + (ulong)((ulong)uVar6 == 0);
    uVar14 = 0;
    local_324 = uVar12;
    local_320 = uVar11;
    do {
      while( true ) {
        Frame::Frame((Frame *)&local_358);
        uVar13 = uVar14;
        while( true ) {
          AnalyzerResults::GetFrame((ulonglong)&local_f8);
          local_338 = local_d8;
          local_348 = local_e8;
          uStack_340 = uStack_e0;
          local_358 = local_f8;
          uStack_350 = uStack_f0;
          Frame::~Frame((Frame *)&local_f8);
          if ((byte)((char)local_338 - 1U) < 2) break;
          uVar13 = uVar13 + 1;
          if (uVar7 <= uVar13) {
            AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar13);
            goto LAB_0010c2e7;
          }
        }
        AnalyzerHelpers::GetTimeString(local_358,local_310,local_31c,local_78,0x40);
        sVar8 = strlen(local_78);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,local_78,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
        if (this->mSettings->mHdlcAddr != HDLC_BASIC_ADDRESS_FIELD) break;
        AnalyzerResults::GetFrame((ulonglong)&local_f8);
        local_338 = local_d8;
        local_348 = local_e8;
        uStack_340 = uStack_e0;
        local_358 = local_f8;
        uStack_350 = uStack_f0;
        Frame::~Frame((Frame *)&local_f8);
        if ((char)local_338 == '\x01') {
          AnalyzerHelpers::GetNumberString(local_348,local_3cc,8,(char *)&local_f8,0x40);
          EscapeByteStr_abi_cxx11_(&local_3c8,this,(Frame *)&local_358);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_2f8,local_3c8._M_dataplus._M_p,
                              local_3c8._M_string_length);
          sVar8 = strlen((char *)&local_f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_f8,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
LAB_0010bd4d:
          if ((char)local_320 != '\0') {
            local_318 = uVar13 + 1;
            local_330 = 0;
            lVar3 = 0;
            do {
              lVar10 = lVar3;
              if (uVar7 <= (ulong)(local_318 + lVar10)) {
                AnalyzerResults::UpdateExportProgressAndCheckForCancel
                          ((ulonglong)this,lVar10 + 1 + uVar13);
                goto LAB_0010c2e7;
              }
              AnalyzerResults::GetFrame((ulonglong)&local_3c8);
              if ((char)local_3a8 == '\a') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
                std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
                std::ostream::put((char)&local_2f8);
                std::ostream::flush();
                uVar13 = uVar13 + lVar10 + 1;
LAB_0010c211:
                Frame::~Frame((Frame *)&local_3c8);
                goto LAB_0010c21b;
              }
              if (1 < (byte)((char)local_3a8 - 3U)) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
                std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
                std::ostream::put((char)&local_2f8);
                std::ostream::flush();
                Frame::~Frame((Frame *)&local_3c8);
                goto LAB_0010bf80;
              }
              if ((int)lVar10 == 0) {
                HVar5 = HdlcAnalyzer::GetFrameType(local_3c8.field_2._M_local_buf[0]);
                local_330 = CONCAT71((int7)(CONCAT44(extraout_var,HVar5) >> 8),HVar5 == HDLC_U_FRAME
                                    );
              }
              AnalyzerHelpers::GetNumberString
                        (local_3c8.field_2._M_allocated_capacity,local_3cc,8,(char *)&local_f8,0x40)
              ;
              if (((local_330 & 1) == 0) &&
                 (this->mSettings->mHdlcControl != HDLC_BASIC_CONTROL_FIELD)) {
                local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0," ","");
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_0010bed5;
                std::ios::clear((int)auStack_3d8 + (int)*(undefined8 *)(local_2f8 + -0x18) + 0xe0);
              }
              else {
                local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                local_3a0._M_string_length = 0;
                local_3a0.field_2._M_local_buf[0] = '\0';
LAB_0010bed5:
                _Var2._M_p = local_3a0._M_dataplus._M_p;
                sVar8 = strlen(local_3a0._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_2f8,_Var2._M_p,sVar8);
              }
              EscapeByteStr_abi_cxx11_(&local_378,this,(Frame *)&local_3c8);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_2f8,local_378._M_dataplus._M_p,
                                  local_378._M_string_length);
              sVar8 = strlen((char *)&local_f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_f8,sVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p);
              }
              bVar15 = (int)lVar10 == 0 & (byte)local_330;
              Frame::~Frame((Frame *)&local_3c8);
              if (bVar15 != 0) break;
LAB_0010bf80:
              lVar3 = lVar10 + 1;
            } while ((int)local_308 != (int)(lVar10 + 1));
            uVar13 = uVar13 + lVar10 + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          if (uVar7 <= uVar13 + 1) {
            AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar13 + 1);
LAB_0010c2e7:
            Frame::~Frame((Frame *)&local_358);
            goto LAB_0010c302;
          }
          uVar14 = uVar13 + 2;
          while( true ) {
            uVar13 = uVar14 - 1;
            AnalyzerResults::GetFrame((ulonglong)&local_3c8);
            if ((char)local_3a8 != '\x05') break;
            AnalyzerHelpers::GetNumberString
                      (local_3c8.field_2._M_allocated_capacity,local_3cc,8,(char *)&local_f8,0x40);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8," ",1);
            EscapeByteStr_abi_cxx11_(&local_3a0,this,(Frame *)&local_3c8);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_2f8,local_3a0._M_dataplus._M_p,
                                local_3a0._M_string_length);
            sVar8 = strlen((char *)&local_f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_f8,sVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              operator_delete(local_3a0._M_dataplus._M_p);
            }
            if (uVar7 == uVar14) {
              AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
              Frame::~Frame((Frame *)&local_3c8);
              goto LAB_0010c2e7;
            }
            Frame::~Frame((Frame *)&local_3c8);
            uVar14 = uVar14 + 1;
          }
          if ((char)local_3a8 != '\a') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
            Frame::~Frame((Frame *)&local_3c8);
            AnalyzerResults::GetFrame((ulonglong)&local_3c8);
            if ((char)local_3a8 == '\x06') {
              AnalyzerHelpers::GetNumberString
                        (local_3c8.field_2._M_allocated_capacity,local_3cc,local_324,
                         (char *)&local_f8,0x80);
              sVar8 = strlen((char *)&local_f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2f8,(char *)&local_f8,sVar8);
              std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
              std::ostream::put((char)&local_2f8);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
              std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
              std::ostream::put((char)&local_2f8);
              std::ostream::flush();
            }
            if (uVar14 < uVar7) {
              cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar14)
              ;
            }
            else {
              cVar4 = '\x01';
              AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar14);
            }
            goto LAB_0010c2aa;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          std::ostream::flush();
          Frame::~Frame((Frame *)&local_3c8);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          std::ostream::flush();
        }
LAB_0010c21b:
        Frame::~Frame((Frame *)&local_358);
        uVar14 = uVar13;
      }
      Frame::Frame((Frame *)&local_3c8,(Frame *)&local_358);
      uVar14 = uVar13;
      do {
        uVar1 = local_3c8.field_2._M_allocated_capacity;
        if ((char)local_3a8 != '\x02') {
          if ((char)local_3a8 != '\a') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
            std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
            std::ostream::put((char)&local_2f8);
            std::ostream::flush();
            goto LAB_0010bd43;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          std::ostream::flush();
          uVar13 = uVar14;
          goto LAB_0010c211;
        }
        AnalyzerHelpers::GetNumberString
                  (local_3c8.field_2._M_allocated_capacity,local_3cc,8,(char *)&local_f8,0x40);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        if (local_3c8.field_2._8_8_ == 0 && (uVar1 & 1) == 0) {
          local_378._M_string_length = 0;
          local_378.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378," ","");
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_2f8,local_378._M_dataplus._M_p,
                            local_378._M_string_length);
        EscapeByteStr_abi_cxx11_(&local_3a0,this,(Frame *)&local_3c8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
        sVar8 = strlen((char *)&local_f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_f8,sVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        if ((uVar1 & 1) == 0) {
          cVar4 = '\b';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
        }
        else {
          uVar14 = uVar14 + 1;
          if (uVar14 < uVar7) {
            AnalyzerResults::GetFrame((ulonglong)&local_3a0);
            local_3a8 = local_380;
            local_3c8.field_2._M_allocated_capacity =
                 CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                          local_3a0.field_2._M_local_buf[0]);
            local_3c8.field_2._8_8_ = local_3a0.field_2._8_8_;
            local_3c8._M_dataplus._M_p = local_3a0._M_dataplus._M_p;
            local_3c8._M_string_length = local_3a0._M_string_length;
            Frame::~Frame((Frame *)&local_3a0);
            cVar4 = '\0';
          }
          else {
            cVar4 = '\x01';
            AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar14);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p);
        }
      } while (cVar4 == '\0');
      if (cVar4 == '\b') {
LAB_0010bd43:
        Frame::~Frame((Frame *)&local_3c8);
        uVar13 = uVar14;
        goto LAB_0010bd4d;
      }
LAB_0010c2aa:
      Frame::~Frame((Frame *)&local_3c8);
      Frame::~Frame((Frame *)&local_358);
    } while ((cVar4 == '\0') || (cVar4 == '\x05'));
  }
LAB_0010c302:
  local_2f8 = _VTT;
  *(undefined8 *)(local_2f0 + *(long *)(_VTT + -0x18) + -8) = _GetInteger;
  std::filebuf::~filebuf(local_2f0);
  std::ios_base::~ios_base(local_200);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    ofstream fileStream( file, ios::out );

    U64 triggerSample = mAnalyzer->GetTriggerSample();
    U32 sampleRate = mAnalyzer->GetSampleRate();

    const char* sepChar = " ";

    U8 fcsBits = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        break;
    }

    fileStream << "Time[s],Address,Control,Information,FCS" << endl;

    char escapeStr[ 5 ];
    AnalyzerHelpers::GetNumberString( HDLC_ESCAPE_SEQ_VALUE, display_base, 8, escapeStr, 5 );

    U64 numFrames = GetNumFrames();
    U64 frameNumber = 0;

    U32 numberOfControlBytes = 0;
    switch( mSettings->mHdlcControl )
    {
    case HDLC_BASIC_CONTROL_FIELD:
        numberOfControlBytes = 1;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
        numberOfControlBytes = 2;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
        numberOfControlBytes = 4;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
        numberOfControlBytes = 8;
        break;
    }

    if( numFrames == 0 )
    {
        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
        return;
    }

    for( ;; )
    {
        bool doAbortFrame = false;
        // Re-sync to start reading HDLC frames from the Address Byte
        Frame firstAddressFrame;
        for( ;; )
        {
            firstAddressFrame = GetFrame( frameNumber );

            // Check for abort
            if( firstAddressFrame.mType == HDLC_FIELD_BASIC_ADDRESS ||
                firstAddressFrame.mType == HDLC_FIELD_EXTENDED_ADDRESS ) // It's and address frame
            {
                break;
            }
            else
            {
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
        }

        // 1)  Time [s]
        char timeStr[ 64 ];
        AnalyzerHelpers::GetTimeString( firstAddressFrame.mStartingSampleInclusive, triggerSample, sampleRate, timeStr, 64 );
        fileStream << timeStr << ",";

        // 2) Address Field
        if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
        {
            firstAddressFrame = GetFrame( frameNumber );
            if( firstAddressFrame.mType != HDLC_FIELD_BASIC_ADDRESS )
            {
                fileStream << "," << endl;
                continue;
            }

            char addressStr[ 64 ];
            AnalyzerHelpers::GetNumberString( firstAddressFrame.mData1, display_base, 8, addressStr, 64 );
            fileStream << EscapeByteStr( firstAddressFrame ) << addressStr << ",";
        }
        else // Check for extended address
        {
            Frame nextAddress = firstAddressFrame;
            for( ;; )
            {
                // Check for abort
                if( nextAddress.mType == HDLC_ABORT_SEQ )
                {
                    fileStream << "," << endl;
                    doAbortFrame = true;
                    break;
                }

                if( nextAddress.mType != HDLC_FIELD_EXTENDED_ADDRESS ) // ERROR
                {
                    fileStream << "," << endl;
                    break;
                }

                bool endOfAddress = ( ( nextAddress.mData1 & 0x01 ) == 0 );

                char addressStr[ 64 ];
                AnalyzerHelpers::GetNumberString( nextAddress.mData1, display_base, 8, addressStr, 64 );
                string sep = ( endOfAddress && nextAddress.mData2 == 0 ) ? string() : string( sepChar );
                fileStream << sep << EscapeByteStr( nextAddress ) << addressStr;

                if( endOfAddress ) // no more bytes of address?
                {
                    fileStream << ",";
                    break;
                }
                else
                {
                    frameNumber++;
                    if( frameNumber >= numFrames )
                    {
                        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                        return;
                    }
                    nextAddress = GetFrame( frameNumber );
                }
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 3) Control Field
        bool isUFrame = false;
        for( U32 i = 0; i < numberOfControlBytes; ++i )
        {
            frameNumber++;
            if( frameNumber >= numFrames )
            {
                UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                return;
            }

            Frame controlFrame = GetFrame( frameNumber );

            // Check for abort
            if( controlFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            if( !( controlFrame.mType == HDLC_FIELD_BASIC_CONTROL || controlFrame.mType == HDLC_FIELD_EXTENDED_CONTROL ) ) // ERROR
            {
                fileStream << "," << endl;
                continue;
            }

            if( i == 0 )
            {
                isUFrame = HdlcAnalyzer::GetFrameType( controlFrame.mData1 ) == HDLC_U_FRAME;
            }

            char controlStr[ 64 ];
            AnalyzerHelpers::GetNumberString( controlFrame.mData1, display_base, 8, controlStr, 64 );
            string sep = ( isUFrame || mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) ? string() : string( sepChar );
            fileStream << sep.c_str() << EscapeByteStr( controlFrame ) << controlStr;

            if( i == 0 && isUFrame )
            {
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        fileStream << ",";

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        // 5) Information Fields
        for( ;; )
        {
            Frame infoFrame = GetFrame( frameNumber );

            // Check for abort
            if( infoFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            // Check for flag
            if( infoFrame.mType == HDLC_FIELD_FLAG )
            {
                fileStream << ",";
                break;
            }

            // Check for info byte
            if( infoFrame.mType == HDLC_FIELD_INFORMATION ) // ERROR
            {
                char infoByteStr[ 64 ];
                AnalyzerHelpers::GetNumberString( infoFrame.mData1, display_base, 8, infoByteStr, 64 );
                fileStream << sepChar << EscapeByteStr( infoFrame ) << infoByteStr;
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
            else
            {
                fileStream << ",";
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 6) FCS Field
        Frame fcsFrame = GetFrame( frameNumber );
        if( fcsFrame.mType != HDLC_FIELD_FCS )
        {
            fileStream << "," << endl;
        }
        else // HDLC_FIELD_FCS Frame
        {
            char fcsStr[ 128 ];
            AnalyzerHelpers::GetNumberString( fcsFrame.mData1, display_base, fcsBits, fcsStr, 128 );
            fileStream << fcsStr << endl;
        }

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        if( UpdateExportProgressAndCheckForCancel( frameNumber, numFrames ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
}